

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::report_selfint_face
          (tetgenmesh *this,point p1,point p2,point p3,face *sface,triface *iedge,int intflag,
          int *types,int *poss)

{
  uint uVar1;
  int iVar2;
  tetrahedron ppdVar3;
  double *pdVar4;
  bool bVar5;
  point pdVar6;
  int *piVar7;
  long lVar8;
  point pdVar9;
  uint *puVar10;
  uint *puVar11;
  uint uVar12;
  point pdVar13;
  uint uVar14;
  char *__format;
  uint uVar15;
  double *e1;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  point local_78;
  double ip [3];
  double u;
  
  uVar14 = *(uint *)((long)sface->sh + (long)this->shmarkindex * 4);
  ppdVar3 = iedge->tet[9];
  if (ppdVar3 == (tetrahedron)0x0) {
LAB_00115b3d:
    ppdVar3 = iedge->tet[8];
    if ((ppdVar3 == (tetrahedron)0x0) ||
       (pdVar4 = ppdVar3[ver2edge[iedge->ver]], pdVar4 == (double *)0x0))
    goto switchD_00115d9a_caseD_2;
    uVar12 = (uint)pdVar4 & 7;
    uVar17 = (ulong)uVar12;
    local_78 = (point)((ulong)pdVar4 & 0xfffffffffffffff8);
    dVar18 = local_78[snextpivot[snextpivot[uVar17]] >> 1];
    pdVar13 = local_78;
    uVar16 = uVar17;
    while (pdVar9 = (point)((ulong)dVar18 & 0xfffffffffffffff8), pdVar9 != (point)0x0) {
      uVar15 = SUB84(dVar18,0) & 7;
      uVar16 = (ulong)snextpivot
                      [snextpivot[pdVar9[sorgpivot[uVar15]] != pdVar13[sorgpivot[uVar16]] ^ uVar15]]
      ;
      pdVar13 = pdVar9;
      dVar18 = pdVar9[snextpivot[snextpivot[uVar16]] >> 1];
    }
    dVar18 = local_78[snextpivot[uVar17] >> 1];
    pdVar9 = local_78;
    while (pdVar6 = (point)((ulong)dVar18 & 0xfffffffffffffff8), pdVar6 != (point)0x0) {
      uVar15 = SUB84(dVar18,0) & 7;
      uVar17 = (ulong)snextpivot[pdVar6[sdestpivot[uVar15]] != pdVar9[sdestpivot[uVar17]] ^ uVar15];
      pdVar9 = pdVar6;
      dVar18 = pdVar6[snextpivot[uVar17] >> 1];
    }
    e1 = (double *)pdVar13[sorgpivot[uVar16]];
    pdVar9 = pdVar9 + sdestpivot[uVar17];
    bVar5 = true;
    dVar18 = 0.0;
    uVar15 = *(uint *)((*(ulong *)((long)local_78 + (ulong)((uint)pdVar4 & 6) * 4) &
                       0xfffffffffffffff8) + (long)this->shmarkindex * 4);
  }
  else {
    pdVar4 = ppdVar3[iedge->ver & 3];
    if (pdVar4 == (double *)0x0) goto LAB_00115b3d;
    local_78 = (point)((ulong)pdVar4 & 0xfffffffffffffff8);
    uVar12 = tspivottbl[iedge->ver][(uint)pdVar4 & 7];
    e1 = (double *)local_78[sorgpivot[(int)uVar12]];
    pdVar9 = local_78 + sdestpivot[(int)uVar12];
    dVar18 = local_78[sapexpivot[(int)uVar12]];
    bVar5 = false;
    uVar15 = uVar14;
  }
  pdVar4 = (double *)*pdVar9;
  if (intflag == 4) {
    if (*types != 4) goto switchD_00115d9a_caseD_2;
    puts("PLC Error:  Two facets are overlapping.");
    lVar8 = (long)this->pointmarkindex;
    printf("  Facet 1:   [%d,%d,%d] #%d\n",(ulong)*(uint *)((long)e1 + lVar8 * 4),
           (ulong)*(uint *)((long)pdVar4 + lVar8 * 4),(ulong)*(uint *)((long)dVar18 + lVar8 * 4),
           (ulong)uVar15);
    lVar8 = (long)this->pointmarkindex;
    uVar12 = *(uint *)((long)p1 + lVar8 * 4);
    uVar15 = *(uint *)((long)p2 + lVar8 * 4);
    uVar1 = *(uint *)((long)p3 + lVar8 * 4);
    __format = "  Facet 2:   [%d,%d,%d] #%d\n";
    goto LAB_00116137;
  }
  if (intflag != 2) {
switchD_00115d9a_caseD_2:
    puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
    puts("  the message above, your input data set, and the exact");
    puts("  command line you used to run this program, thank you.");
    exit(2);
  }
  u = 0.0;
  planelineint((tetgenmesh *)ip,p1,p2,p3,e1,pdVar4,ip,&u);
  switch(*types) {
  default:
    goto switchD_00115d9a_caseD_2;
  case 5:
  case 6:
    if (poss[1] == 0) {
      piVar7 = orgpivot;
    }
    else {
      if (poss[1] != 1) goto switchD_00115d9a_caseD_2;
      piVar7 = destpivot;
    }
    ppdVar3 = iedge->tet[piVar7[iedge->ver]];
    if ((*(int *)((long)ppdVar3 + (long)this->pointmarkindex * 4 + 4) >> 8) - 6U < 3)
    goto switchD_00115d9a_caseD_2;
    printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",*ppdVar3,ppdVar3[1],
           ppdVar3[2]);
    printf("  Vertex:  #%d\n",(ulong)*(uint *)((long)ppdVar3 + (long)this->pointmarkindex * 4));
    iVar2 = this->pointmarkindex;
LAB_00116121:
    lVar8 = (long)iVar2;
    puVar11 = (uint *)((long)p2 + lVar8 * 4);
    puVar10 = (uint *)(lVar8 * 4 + (long)p1);
    __format = "  Facet:   [%d,%d,%d] #%d\n";
    local_78 = p3;
    break;
  case 7:
    iVar2 = *poss;
    pdVar13 = p1;
    if (((iVar2 != 0) && (pdVar13 = p3, iVar2 != 2)) && (pdVar13 = p2, iVar2 != 1)) {
      terminatetetgen(this,2);
      pdVar13 = (point)0x0;
    }
    if ((*(int *)((long)pdVar13 + (long)this->pointmarkindex * 4 + 4) >> 8) - 6U < 3)
    goto switchD_00115d9a_caseD_2;
    if (!bVar5) {
      printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",*pdVar13,pdVar13[1],
             pdVar13[2]);
      printf("  Vertex:  #%d\n",(ulong)*(uint *)((long)pdVar13 + (long)this->pointmarkindex * 4));
      iVar2 = this->pointmarkindex;
      goto LAB_00116121;
    }
    printf("PLC Error:  A vertex and a segment intersect at (%g,%g,%g)\n",*pdVar13,pdVar13[1],
           pdVar13[2]);
    printf("  Vertex:  #%d\n",(ulong)*(uint *)((long)pdVar13 + (long)this->pointmarkindex * 4));
    puVar10 = (uint *)((long)e1 + (long)this->pointmarkindex * 4);
    puVar11 = (uint *)((long)pdVar4 + (long)this->pointmarkindex * 4);
    lVar8 = (long)this->shmarkindex;
    __format = "  Segment: [%d,%d] #%d (%d)\n";
    uVar14 = uVar15;
    break;
  case 8:
  case 9:
    if (bVar5) {
      printf("PLC Error:  A segment and a facet intersect at point");
      printf(" (%g,%g,%g).\n",ip[0],ip[1],ip[2]);
      printf("  Segment: [%d,%d] #%d (%d)\n",
             (ulong)*(uint *)((long)e1 + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)pdVar4 + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)local_78 + (long)this->shmarkindex * 4),(ulong)uVar15);
      iVar2 = this->pointmarkindex;
      __format = "  Facet:   [%d,%d,%d] #%d\n";
    }
    else {
      printf("PLC Error:  Two facets intersect at point");
      printf(" (%g,%g,%g).\n",ip[0],ip[1],ip[2]);
      lVar8 = (long)this->pointmarkindex;
      printf("  Facet 1: [%d,%d,%d] #%d\n",(ulong)*(uint *)((long)e1 + lVar8 * 4),
             (ulong)*(uint *)((long)pdVar4 + lVar8 * 4),
             (ulong)*(uint *)((long)local_78[sorgpivot[(int)uVar12]] + lVar8 * 4),
             (ulong)*(uint *)((long)local_78 + (long)this->shmarkindex * 4));
      iVar2 = this->pointmarkindex;
      __format = "  Facet 2: [%d,%d,%d] #%d\n";
    }
    lVar8 = (long)iVar2;
    puVar11 = (uint *)((long)p2 + lVar8 * 4);
    puVar10 = (uint *)((long)p1 + lVar8 * 4);
    local_78 = p3;
  }
  uVar12 = *puVar10;
  uVar15 = *puVar11;
  uVar1 = *(uint *)((long)local_78 + lVar8 * 4);
LAB_00116137:
  printf(__format,(ulong)uVar12,(ulong)uVar15,(ulong)uVar1,(ulong)uVar14);
  puts("A self-intersection was detected. Program stopped.");
  puts("Hint: use -d option to detect all self-intersections.");
  exit(3);
}

Assistant:

int tetgenmesh::report_selfint_face(point p1, point p2, point p3, face* sface,
  triface* iedge, int intflag, int* types, int* poss)
{
  face iface;
  point e1 = NULL, e2 = NULL, e3 = NULL;
  int etype = 0, geomtag = 0, facemark = 0;

  geomtag = shellmark(*sface);

  if (issubface(*iedge)) {
    tspivot(*iedge, iface);
    e1 = sorg(iface);
    e2 = sdest(iface);
    e3 = sapex(iface);
    etype = 2;
    facemark = geomtag;
  } else if (issubseg(*iedge)) {
    tsspivot1(*iedge, iface);
    e1 = farsorg(iface);
    e2 = farsdest(iface);
    etype = 1;
    face parentsh;
    spivot(iface, parentsh);
    facemark = shellmark(parentsh);
  } else {
    terminatetetgen(this, 2);
  }

  if (intflag == 2) {
    // The triangle and the edge intersect only at one point.
    REAL ip[3], u = 0;
    planelineint(p1, p2, p3, e1, e2, ip, &u);
    if ((types[0] == (int) ACROSSFACE) ||
        (types[0] == (int) ACROSSEDGE)) {
      // The triangle and the edge intersect in their interiors. 
      if (etype == 1) {
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n", ip[0], ip[1], ip[2]);
        printf("  Segment: [%d,%d] #%d (%d)\n", pointmark(e1), pointmark(e2),
               shellmark(iface), facemark);
        printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(p1), 
               pointmark(p2), pointmark(p3), geomtag);
      } else {
        printf("PLC Error:  Two facets intersect at point");
        printf(" (%g,%g,%g).\n", ip[0], ip[1], ip[2]);
        printf("  Facet 1: [%d,%d,%d] #%d\n", pointmark(e1), pointmark(e2),
               pointmark(sorg(iface)), shellmark(iface));
        printf("  Facet 2: [%d,%d,%d] #%d\n", pointmark(p1), 
               pointmark(p2), pointmark(p3), geomtag);
      }
    } else if (types[0] == (int) ACROSSVERT) {
      // A vertex of the triangle and the edge intersect.
      point crosspt = NULL;
      if (poss[0] == 0) {
        crosspt = p1;
      } else if (poss[0] == 1) {
        crosspt = p2;
      } else if (poss[0] == 2) {
        crosspt = p3;
      } else {
        terminatetetgen(this, 2);
      }
      if (!issteinerpoint(crosspt)) {
        if (etype == 1) {
          printf("PLC Error:  A vertex and a segment intersect at (%g,%g,%g)\n",
                 crosspt[0], crosspt[1], crosspt[2]);
          printf("  Vertex:  #%d\n", pointmark(crosspt));
          printf("  Segment: [%d,%d] #%d (%d)\n", pointmark(e1), pointmark(e2),
                 shellmark(iface), facemark);
        } else {
          printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",
                 crosspt[0], crosspt[1], crosspt[2]);
          printf("  Vertex:  #%d\n", pointmark(crosspt));
          printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(p1), 
                 pointmark(p2), pointmark(p3), geomtag);
        }
      } else {
        // It is a Steiner point. To be processed.
        terminatetetgen(this, 2);
      }
    } else if ((types[0] == (int) TOUCHFACE) ||
               (types[0] == (int) TOUCHEDGE)) {
      // The triangle and a vertex of the edge intersect.
      point touchpt = NULL;
      if (poss[1] == 0) {
        touchpt = org(*iedge);
      } else if (poss[1] == 1) {
        touchpt = dest(*iedge);
      } else {
        terminatetetgen(this, 2);
      }
      if (!issteinerpoint(touchpt)) {
        printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",
               touchpt[0], touchpt[1], touchpt[2]);
        printf("  Vertex:  #%d\n", pointmark(touchpt));
        printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(p1), 
               pointmark(p2), pointmark(p3), geomtag);
      } else {
        // It is a Steiner point. To be processed.
        terminatetetgen(this, 2);
      }
    } else if (types[0] == (int) SHAREVERT) {
      terminatetetgen(this, 2);
    } else {
      terminatetetgen(this, 2);
    }
  } else if (intflag == 4) {
    if (types[0] == (int) SHAREFACE) {
      printf("PLC Error:  Two facets are overlapping.\n");
      printf("  Facet 1:   [%d,%d,%d] #%d\n", pointmark(e1), 
             pointmark(e2), pointmark(e3), facemark);
      printf("  Facet 2:   [%d,%d,%d] #%d\n", pointmark(p1), 
             pointmark(p2), pointmark(p3), geomtag);
    } else {
      terminatetetgen(this, 2);
    }
  } else {
    terminatetetgen(this, 2);
  }

  terminatetetgen(this, 3);
  return 0;
}